

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.hh
# Opt level: O0

void __thiscall QPDFWriter::ProgressReporter::ProgressReporter(ProgressReporter *this)

{
  ProgressReporter *this_local;
  
  this->_vptr_ProgressReporter = (_func_int **)&PTR__ProgressReporter_005970e0;
  return;
}

Assistant:

class QPDF_DLL_CLASS ProgressReporter
    {
      public:
        QPDF_DLL
        virtual ~ProgressReporter();

        // This method is called with a value from 0 to 100 to indicate approximate progress through
        // the write process. See registerProgressReporter.
        virtual void reportProgress(int) = 0;
    }